

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_defineProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue JVar1;
  JSValue obj_00;
  JSAtom JVar2;
  int iVar3;
  undefined8 in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSValueUnion *in_R8;
  int in_R9D;
  JSValue JVar4;
  int unaff_retaddr;
  JSAtom atom;
  int flags;
  int ret;
  JSValue desc;
  JSValue prop;
  JSValue obj;
  JSAtom in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int64_t iVar8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uStack_c;
  
  JVar5 = (JSValueUnion)in_R8->ptr;
  JVar6 = in_R8[1];
  if (JVar6.int32 == -1) {
    JVar2 = JS_ValueToAtom((JSContext *)in_R8[3].ptr,*(JSValue *)in_R8);
    if (JVar2 == 0) {
      uVar7 = 0;
      iVar8 = 6;
    }
    else {
      obj_00.tag._0_4_ = in_stack_ffffffffffffffe0;
      obj_00.u = (JSValueUnion)in_stack_ffffffffffffffd8;
      obj_00.tag._4_4_ = in_stack_ffffffffffffffe4;
      JVar4.tag._0_4_ = in_stack_ffffffffffffffd0;
      JVar4.u = (JSValueUnion)in_RDX;
      JVar4.tag._4_4_ = in_stack_ffffffffffffffd4;
      iVar3 = JS_DefinePropertyDesc
                        (in_RSI,obj_00,(JSAtom)((ulong)in_RDI >> 0x20),JVar4,unaff_retaddr);
      JS_FreeAtom((JSContext *)CONCAT44(JVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c);
      if (iVar3 < 0) {
        uVar7 = 0;
        iVar8 = 6;
      }
      else if (in_R9D == 0) {
        v.tag = (int64_t)JVar6.ptr;
        v.u.float64 = JVar5.float64;
        JVar4 = JS_DupValue(in_RDI,v);
        uVar7 = JVar4.u._0_4_;
        in_stack_ffffffffffffffd4 = JVar4.u._4_4_;
        iVar8 = JVar4.tag;
      }
      else {
        uVar7 = (uint)(iVar3 != 0);
        iVar8 = 1;
        in_stack_ffffffffffffffd4 = uStack_c;
      }
    }
  }
  else {
    JVar4 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1a917c);
    uVar7 = JVar4.u._0_4_;
    in_stack_ffffffffffffffd4 = JVar4.u._4_4_;
    iVar8 = JVar4.tag;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar7;
  JVar1.tag = iVar8;
  return JVar1;
}

Assistant:

static JSValue js_object_defineProperty(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv, int magic)
{
    JSValueConst obj, prop, desc;
    int ret, flags;
    JSAtom atom;

    obj = argv[0];
    prop = argv[1];
    desc = argv[2];

    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    flags = 0;
    if (!magic)
        flags |= JS_PROP_THROW;
    ret = JS_DefinePropertyDesc(ctx, obj, atom, desc, flags);
    JS_FreeAtom(ctx, atom);
    if (ret < 0) {
        return JS_EXCEPTION;
    } else if (magic) {
        return JS_NewBool(ctx, ret);
    } else {
        return JS_DupValue(ctx, obj);
    }
}